

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.cpp
# Opt level: O3

void __thiscall QOpenGLExtensions::flushShared(QOpenGLExtensions *this)

{
  QOpenGLFunctionsPrivate *pQVar1;
  char *__haystack;
  char *pcVar2;
  long lVar3;
  
  pQVar1 = (this->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr;
  if (*(char *)((long)&pQVar1[2].field_0 + 600) == '\0') {
    *(undefined2 *)((long)&pQVar1[2].field_0 + 600) = 1;
    __haystack = (char *)(*(pQVar1->field_0).functions[0x1a])(0x1f00);
    if (__haystack != (char *)0x0) {
      lVar3 = 0;
      do {
        pcVar2 = strstr(__haystack,
                        (char *)((long)&_ZZN17QOpenGLExtensions11flushSharedEvE11flushEnough_rel +
                                (long)*(int *)((long)&
                                                  _ZZN17QOpenGLExtensions11flushSharedEvE11flushEnough_rel
                                              + lVar3)));
        if (pcVar2 != (char *)0x0) {
          *(undefined1 *)((long)&pQVar1[2].field_0 + 0x259) = 1;
          break;
        }
        lVar3 = lVar3 + 4;
      } while (lVar3 != 0x10);
    }
  }
  (**(code **)((long)&((this->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0 +
              (ulong)*(byte *)((long)&pQVar1[2].field_0 + 0x259) * 8 + 0x90))();
  return;
}

Assistant:

void QOpenGLExtensions::flushShared()
{
    Q_D(QOpenGLExtensions);

    if (!d->flushVendorChecked) {
        d->flushVendorChecked = true;
        // It is not quite clear if glFlush() is sufficient to synchronize access to
        // resources between sharing contexts in the same thread. On most platforms this
        // is enough (e.g. iOS explicitly documents it), while certain drivers only work
        // properly when doing glFinish().
        d->flushIsSufficientToSyncContexts = false; // default to false, not guaranteed by the spec
        const char *vendor = (const char *) glGetString(GL_VENDOR);
        if (vendor) {
            static const char *const flushEnough[] = { "Apple", "ATI", "Intel", "NVIDIA" };
            for (size_t i = 0; i < sizeof(flushEnough) / sizeof(const char *); ++i) {
                if (strstr(vendor, flushEnough[i])) {
                    d->flushIsSufficientToSyncContexts = true;
                    break;
                }
            }
        }
    }

    if (d->flushIsSufficientToSyncContexts)
        glFlush();
    else
        glFinish();
}